

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  float **ppfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  Geometry *pGVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar34;
  long lVar35;
  ulong uVar36;
  RayHitK<4> *pRVar37;
  Scene *pSVar38;
  undefined1 (*pauVar39) [16];
  ulong uVar40;
  long lVar41;
  undefined1 (*pauVar42) [16];
  ulong uVar43;
  undefined1 (*pauVar44) [16];
  undefined1 (*pauVar45) [16];
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  undefined4 uVar49;
  ulong unaff_R13;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 extraout_var [56];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [64];
  undefined1 auVar101 [32];
  undefined1 auVar102 [64];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [64];
  undefined1 auVar108 [16];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [64];
  undefined1 auVar115 [16];
  undefined1 auVar116 [64];
  float fVar117;
  float fVar122;
  undefined1 auVar118 [16];
  float fVar120;
  float fVar121;
  undefined1 auVar119 [64];
  Scene *scene;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_27e9;
  ulong local_27e8;
  ulong local_27e0;
  ulong local_27d8;
  ulong local_27d0;
  Scene *local_27c8;
  undefined1 local_27c0 [16];
  undefined1 local_27b0 [16];
  undefined1 local_27a0 [16];
  undefined1 local_2790 [16];
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 *local_2770;
  long local_2768;
  ulong local_2760;
  ulong local_2758;
  ulong local_2750;
  long local_2748;
  undefined8 *local_2740;
  void *local_2738;
  RTCRayQueryContext *local_2730;
  RayHitK<4> *local_2728;
  undefined1 (*local_2720) [16];
  undefined4 local_2718;
  undefined8 local_2710;
  undefined8 uStack_2708;
  undefined1 local_2700 [32];
  undefined1 local_26e0 [16];
  undefined1 *local_26d0;
  undefined1 local_26c0 [16];
  undefined1 local_26b0 [16];
  undefined1 local_26a0 [16];
  undefined1 local_2690 [16];
  undefined1 local_2680 [16];
  undefined1 local_2670 [16];
  undefined1 local_2660 [2] [16];
  undefined1 local_2640 [32];
  undefined1 local_2610 [16];
  undefined1 local_2600 [16];
  undefined1 local_25f0 [16];
  undefined1 local_25e0 [16];
  undefined1 local_25d0 [16];
  undefined1 local_25c0 [16];
  undefined1 local_25b0 [16];
  undefined1 local_25a0 [16];
  undefined1 local_2590 [16];
  undefined1 local_2580 [16];
  undefined1 local_2570 [16];
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined1 local_2550 [16];
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined1 local_2520 [16];
  undefined1 local_2510 [16];
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  uint local_24e0;
  uint uStack_24dc;
  uint uStack_24d8;
  uint uStack_24d4;
  uint uStack_24d0;
  uint uStack_24cc;
  uint uStack_24c8;
  uint uStack_24c4;
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  pauVar45 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar49 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_23c0._4_4_ = uVar49;
  local_23c0._0_4_ = uVar49;
  local_23c0._8_4_ = uVar49;
  local_23c0._12_4_ = uVar49;
  local_23c0._16_4_ = uVar49;
  local_23c0._20_4_ = uVar49;
  local_23c0._24_4_ = uVar49;
  local_23c0._28_4_ = uVar49;
  auVar92 = ZEXT3264(local_23c0);
  uVar49 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_23e0._4_4_ = uVar49;
  local_23e0._0_4_ = uVar49;
  local_23e0._8_4_ = uVar49;
  local_23e0._12_4_ = uVar49;
  local_23e0._16_4_ = uVar49;
  local_23e0._20_4_ = uVar49;
  local_23e0._24_4_ = uVar49;
  local_23e0._28_4_ = uVar49;
  auVar100 = ZEXT3264(local_23e0);
  uVar49 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2400._4_4_ = uVar49;
  local_2400._0_4_ = uVar49;
  local_2400._8_4_ = uVar49;
  local_2400._12_4_ = uVar49;
  local_2400._16_4_ = uVar49;
  local_2400._20_4_ = uVar49;
  local_2400._24_4_ = uVar49;
  local_2400._28_4_ = uVar49;
  auVar102 = ZEXT3264(local_2400);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar24 = fVar2 * 0.99999964;
  local_2420._4_4_ = fVar24;
  local_2420._0_4_ = fVar24;
  local_2420._8_4_ = fVar24;
  local_2420._12_4_ = fVar24;
  local_2420._16_4_ = fVar24;
  local_2420._20_4_ = fVar24;
  local_2420._24_4_ = fVar24;
  local_2420._28_4_ = fVar24;
  auVar107 = ZEXT3264(local_2420);
  fVar24 = fVar3 * 0.99999964;
  local_2440._4_4_ = fVar24;
  local_2440._0_4_ = fVar24;
  local_2440._8_4_ = fVar24;
  local_2440._12_4_ = fVar24;
  local_2440._16_4_ = fVar24;
  local_2440._20_4_ = fVar24;
  local_2440._24_4_ = fVar24;
  local_2440._28_4_ = fVar24;
  auVar109 = ZEXT3264(local_2440);
  fVar24 = fVar4 * 0.99999964;
  local_2460._4_4_ = fVar24;
  local_2460._0_4_ = fVar24;
  local_2460._8_4_ = fVar24;
  local_2460._12_4_ = fVar24;
  local_2460._16_4_ = fVar24;
  local_2460._20_4_ = fVar24;
  local_2460._24_4_ = fVar24;
  local_2460._28_4_ = fVar24;
  auVar110 = ZEXT3264(local_2460);
  fVar2 = fVar2 * 1.0000004;
  local_2480._4_4_ = fVar2;
  local_2480._0_4_ = fVar2;
  local_2480._8_4_ = fVar2;
  local_2480._12_4_ = fVar2;
  local_2480._16_4_ = fVar2;
  local_2480._20_4_ = fVar2;
  local_2480._24_4_ = fVar2;
  local_2480._28_4_ = fVar2;
  auVar111 = ZEXT3264(local_2480);
  fVar3 = fVar3 * 1.0000004;
  local_24a0._4_4_ = fVar3;
  local_24a0._0_4_ = fVar3;
  local_24a0._8_4_ = fVar3;
  local_24a0._12_4_ = fVar3;
  local_24a0._16_4_ = fVar3;
  local_24a0._20_4_ = fVar3;
  local_24a0._24_4_ = fVar3;
  local_24a0._28_4_ = fVar3;
  auVar114 = ZEXT3264(local_24a0);
  fVar4 = fVar4 * 1.0000004;
  local_24c0._4_4_ = fVar4;
  local_24c0._0_4_ = fVar4;
  local_24c0._8_4_ = fVar4;
  local_24c0._12_4_ = fVar4;
  local_24c0._16_4_ = fVar4;
  local_24c0._20_4_ = fVar4;
  local_24c0._24_4_ = fVar4;
  local_24c0._28_4_ = fVar4;
  auVar116 = ZEXT3264(local_24c0);
  uVar46 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar43 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_27e0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_2750 = uVar46 ^ 0x20;
  local_2758 = uVar43 ^ 0x20;
  iVar34 = (tray->tnear).field_0.i[k];
  local_2640._4_4_ = iVar34;
  local_2640._0_4_ = iVar34;
  local_2640._8_4_ = iVar34;
  local_2640._12_4_ = iVar34;
  local_2640._16_4_ = iVar34;
  local_2640._20_4_ = iVar34;
  local_2640._24_4_ = iVar34;
  local_2640._28_4_ = iVar34;
  auVar119 = ZEXT3264(local_2640);
  iVar34 = (tray->tfar).field_0.i[k];
  auVar56 = ZEXT3264(CONCAT428(iVar34,CONCAT424(iVar34,CONCAT420(iVar34,CONCAT416(iVar34,CONCAT412(
                                                  iVar34,CONCAT48(iVar34,CONCAT44(iVar34,iVar34)))))
                                               )));
  local_2760 = local_27e0 ^ 0x20;
  local_2770 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  uVar36 = local_27e0;
  local_27e8 = uVar43;
  local_27d8 = uVar46;
  do {
    do {
      do {
        if (pauVar45 == (undefined1 (*) [16])&local_23a0) {
          return;
        }
        pauVar44 = pauVar45 + -1;
        pauVar45 = pauVar45 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar44 + 8));
      uVar48 = *(ulong *)*pauVar45;
      do {
        auVar101 = auVar102._0_32_;
        auVar99 = auVar100._0_32_;
        auVar91 = auVar92._0_32_;
        if ((uVar48 & 8) == 0) {
          auVar25 = vsubps_avx(*(undefined1 (*) [32])(uVar48 + 0x40 + uVar46),auVar91);
          auVar26._4_4_ = auVar107._4_4_ * auVar25._4_4_;
          auVar26._0_4_ = auVar107._0_4_ * auVar25._0_4_;
          auVar26._8_4_ = auVar107._8_4_ * auVar25._8_4_;
          auVar26._12_4_ = auVar107._12_4_ * auVar25._12_4_;
          auVar26._16_4_ = auVar107._16_4_ * auVar25._16_4_;
          auVar26._20_4_ = auVar107._20_4_ * auVar25._20_4_;
          auVar26._24_4_ = auVar107._24_4_ * auVar25._24_4_;
          auVar26._28_4_ = auVar25._28_4_;
          auVar25 = vsubps_avx(*(undefined1 (*) [32])(uVar48 + 0x40 + uVar43),auVar99);
          auVar27._4_4_ = auVar109._4_4_ * auVar25._4_4_;
          auVar27._0_4_ = auVar109._0_4_ * auVar25._0_4_;
          auVar27._8_4_ = auVar109._8_4_ * auVar25._8_4_;
          auVar27._12_4_ = auVar109._12_4_ * auVar25._12_4_;
          auVar27._16_4_ = auVar109._16_4_ * auVar25._16_4_;
          auVar27._20_4_ = auVar109._20_4_ * auVar25._20_4_;
          auVar27._24_4_ = auVar109._24_4_ * auVar25._24_4_;
          auVar27._28_4_ = auVar25._28_4_;
          auVar25 = vmaxps_avx(auVar26,auVar27);
          auVar26 = vsubps_avx(*(undefined1 (*) [32])(uVar48 + 0x40 + uVar36),auVar101);
          auVar28._4_4_ = auVar110._4_4_ * auVar26._4_4_;
          auVar28._0_4_ = auVar110._0_4_ * auVar26._0_4_;
          auVar28._8_4_ = auVar110._8_4_ * auVar26._8_4_;
          auVar28._12_4_ = auVar110._12_4_ * auVar26._12_4_;
          auVar28._16_4_ = auVar110._16_4_ * auVar26._16_4_;
          auVar28._20_4_ = auVar110._20_4_ * auVar26._20_4_;
          auVar28._24_4_ = auVar110._24_4_ * auVar26._24_4_;
          auVar28._28_4_ = auVar26._28_4_;
          auVar26 = vmaxps_avx(auVar28,auVar119._0_32_);
          local_2700 = vmaxps_avx(auVar25,auVar26);
          auVar25 = vsubps_avx(*(undefined1 (*) [32])(uVar48 + 0x40 + local_2750),auVar91);
          auVar29._4_4_ = auVar111._4_4_ * auVar25._4_4_;
          auVar29._0_4_ = auVar111._0_4_ * auVar25._0_4_;
          auVar29._8_4_ = auVar111._8_4_ * auVar25._8_4_;
          auVar29._12_4_ = auVar111._12_4_ * auVar25._12_4_;
          auVar29._16_4_ = auVar111._16_4_ * auVar25._16_4_;
          auVar29._20_4_ = auVar111._20_4_ * auVar25._20_4_;
          auVar29._24_4_ = auVar111._24_4_ * auVar25._24_4_;
          auVar29._28_4_ = auVar25._28_4_;
          auVar25 = vsubps_avx(*(undefined1 (*) [32])(uVar48 + 0x40 + local_2758),auVar99);
          auVar30._4_4_ = auVar114._4_4_ * auVar25._4_4_;
          auVar30._0_4_ = auVar114._0_4_ * auVar25._0_4_;
          auVar30._8_4_ = auVar114._8_4_ * auVar25._8_4_;
          auVar30._12_4_ = auVar114._12_4_ * auVar25._12_4_;
          auVar30._16_4_ = auVar114._16_4_ * auVar25._16_4_;
          auVar30._20_4_ = auVar114._20_4_ * auVar25._20_4_;
          auVar30._24_4_ = auVar114._24_4_ * auVar25._24_4_;
          auVar30._28_4_ = auVar25._28_4_;
          auVar25 = vminps_avx(auVar29,auVar30);
          auVar26 = vsubps_avx(*(undefined1 (*) [32])(uVar48 + 0x40 + local_2760),auVar101);
          auVar31._4_4_ = auVar116._4_4_ * auVar26._4_4_;
          auVar31._0_4_ = auVar116._0_4_ * auVar26._0_4_;
          auVar31._8_4_ = auVar116._8_4_ * auVar26._8_4_;
          auVar31._12_4_ = auVar116._12_4_ * auVar26._12_4_;
          auVar31._16_4_ = auVar116._16_4_ * auVar26._16_4_;
          auVar31._20_4_ = auVar116._20_4_ * auVar26._20_4_;
          auVar31._24_4_ = auVar116._24_4_ * auVar26._24_4_;
          auVar31._28_4_ = auVar26._28_4_;
          auVar26 = vminps_avx(auVar31,auVar56._0_32_);
          auVar25 = vminps_avx(auVar25,auVar26);
          auVar25 = vcmpps_avx(local_2700,auVar25,2);
          uVar49 = vmovmskps_avx(auVar25);
          unaff_R13 = CONCAT44((int)(unaff_R13 >> 0x20),uVar49);
        }
        if ((uVar48 & 8) == 0) {
          if (unaff_R13 == 0) {
            iVar34 = 4;
          }
          else {
            uVar47 = uVar48 & 0xfffffffffffffff0;
            lVar35 = 0;
            for (uVar48 = unaff_R13; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000) {
              lVar35 = lVar35 + 1;
            }
            iVar34 = 0;
            uVar40 = unaff_R13 - 1 & unaff_R13;
            uVar48 = *(ulong *)(uVar47 + lVar35 * 8);
            if (uVar40 != 0) {
              uVar7 = *(uint *)(local_2700 + lVar35 * 4);
              lVar35 = 0;
              for (uVar36 = uVar40; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
                lVar35 = lVar35 + 1;
              }
              uVar40 = uVar40 - 1 & uVar40;
              uVar8 = *(ulong *)(uVar47 + lVar35 * 8);
              uVar6 = *(uint *)(local_2700 + lVar35 * 4);
              uVar36 = local_27e0;
              uVar43 = local_27e8;
              if (uVar40 == 0) {
                if (uVar7 < uVar6) {
                  *(ulong *)*pauVar45 = uVar8;
                  *(uint *)(*pauVar45 + 8) = uVar6;
                  pauVar45 = pauVar45 + 1;
                }
                else {
                  *(ulong *)*pauVar45 = uVar48;
                  *(uint *)(*pauVar45 + 8) = uVar7;
                  pauVar45 = pauVar45 + 1;
                  uVar48 = uVar8;
                }
              }
              else {
                auVar57._8_8_ = 0;
                auVar57._0_8_ = uVar48;
                auVar57 = vpunpcklqdq_avx(auVar57,ZEXT416(uVar7));
                auVar67._8_8_ = 0;
                auVar67._0_8_ = uVar8;
                auVar67 = vpunpcklqdq_avx(auVar67,ZEXT416(uVar6));
                lVar35 = 0;
                for (uVar48 = uVar40; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000)
                {
                  lVar35 = lVar35 + 1;
                }
                uVar40 = uVar40 - 1 & uVar40;
                auVar70._8_8_ = 0;
                auVar70._0_8_ = *(ulong *)(uVar47 + lVar35 * 8);
                auVar58 = vpunpcklqdq_avx(auVar70,ZEXT416(*(uint *)(local_2700 + lVar35 * 4)));
                auVar70 = vpcmpgtd_avx(auVar67,auVar57);
                if (uVar40 == 0) {
                  auVar80 = vpshufd_avx(auVar70,0xaa);
                  auVar70 = vblendvps_avx(auVar67,auVar57,auVar80);
                  auVar57 = vblendvps_avx(auVar57,auVar67,auVar80);
                  auVar67 = vpcmpgtd_avx(auVar58,auVar70);
                  auVar80 = vpshufd_avx(auVar67,0xaa);
                  auVar67 = vblendvps_avx(auVar58,auVar70,auVar80);
                  auVar70 = vblendvps_avx(auVar70,auVar58,auVar80);
                  auVar58 = vpcmpgtd_avx(auVar70,auVar57);
                  auVar80 = vpshufd_avx(auVar58,0xaa);
                  auVar58 = vblendvps_avx(auVar70,auVar57,auVar80);
                  auVar57 = vblendvps_avx(auVar57,auVar70,auVar80);
                  *pauVar45 = auVar57;
                  pauVar45[1] = auVar58;
                  uVar48 = auVar67._0_8_;
                  pauVar45 = pauVar45 + 2;
                }
                else {
                  lVar35 = 0;
                  for (uVar46 = uVar40; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000
                      ) {
                    lVar35 = lVar35 + 1;
                  }
                  uVar40 = uVar40 - 1 & uVar40;
                  auVar80._8_8_ = 0;
                  auVar80._0_8_ = *(ulong *)(uVar47 + lVar35 * 8);
                  auVar80 = vpunpcklqdq_avx(auVar80,ZEXT416(*(uint *)(local_2700 + lVar35 * 4)));
                  if (uVar40 == 0) {
                    auVar60 = vpshufd_avx(auVar70,0xaa);
                    auVar70 = vblendvps_avx(auVar67,auVar57,auVar60);
                    auVar57 = vblendvps_avx(auVar57,auVar67,auVar60);
                    auVar67 = vpcmpgtd_avx(auVar80,auVar58);
                    auVar60 = vpshufd_avx(auVar67,0xaa);
                    auVar67 = vblendvps_avx(auVar80,auVar58,auVar60);
                    auVar58 = vblendvps_avx(auVar58,auVar80,auVar60);
                    auVar80 = vpcmpgtd_avx(auVar58,auVar57);
                    auVar60 = vpshufd_avx(auVar80,0xaa);
                    auVar80 = vblendvps_avx(auVar58,auVar57,auVar60);
                    auVar57 = vblendvps_avx(auVar57,auVar58,auVar60);
                    auVar58 = vpcmpgtd_avx(auVar67,auVar70);
                    auVar60 = vpshufd_avx(auVar58,0xaa);
                    auVar58 = vblendvps_avx(auVar67,auVar70,auVar60);
                    auVar67 = vblendvps_avx(auVar70,auVar67,auVar60);
                    auVar70 = vpcmpgtd_avx(auVar80,auVar67);
                    auVar60 = vpshufd_avx(auVar70,0xaa);
                    auVar70 = vblendvps_avx(auVar80,auVar67,auVar60);
                    auVar67 = vblendvps_avx(auVar67,auVar80,auVar60);
                    *pauVar45 = auVar57;
                    pauVar45[1] = auVar67;
                    pauVar45[2] = auVar70;
                    uVar48 = auVar58._0_8_;
                    pauVar44 = pauVar45 + 3;
                  }
                  else {
                    *pauVar45 = auVar57;
                    pauVar45[1] = auVar67;
                    pauVar45[2] = auVar58;
                    pauVar45[3] = auVar80;
                    lVar35 = 0x30;
                    do {
                      lVar41 = lVar35;
                      lVar35 = 0;
                      for (uVar46 = uVar40; (uVar46 & 1) == 0;
                          uVar46 = uVar46 >> 1 | 0x8000000000000000) {
                        lVar35 = lVar35 + 1;
                      }
                      auVar58._8_8_ = 0;
                      auVar58._0_8_ = *(ulong *)(uVar47 + lVar35 * 8);
                      auVar57 = vpunpcklqdq_avx(auVar58,ZEXT416(*(uint *)(local_2700 + lVar35 * 4)))
                      ;
                      *(undefined1 (*) [16])(pauVar45[1] + lVar41) = auVar57;
                      uVar40 = uVar40 - 1 & uVar40;
                      lVar35 = lVar41 + 0x10;
                    } while (uVar40 != 0);
                    pauVar44 = (undefined1 (*) [16])(pauVar45[1] + lVar41);
                    if (lVar41 + 0x10 != 0) {
                      lVar35 = 0x10;
                      pauVar39 = pauVar45;
                      do {
                        auVar57 = pauVar39[1];
                        uVar7 = *(uint *)(pauVar39[1] + 8);
                        pauVar39 = pauVar39 + 1;
                        lVar41 = lVar35;
                        do {
                          if (uVar7 <= *(uint *)(pauVar45[-1] + lVar41 + 8)) {
                            pauVar42 = (undefined1 (*) [16])(*pauVar45 + lVar41);
                            break;
                          }
                          *(undefined1 (*) [16])(*pauVar45 + lVar41) =
                               *(undefined1 (*) [16])(pauVar45[-1] + lVar41);
                          lVar41 = lVar41 + -0x10;
                          pauVar42 = pauVar45;
                        } while (lVar41 != 0);
                        *pauVar42 = auVar57;
                        lVar35 = lVar35 + 0x10;
                      } while (pauVar44 != pauVar39);
                    }
                    uVar48 = *(ulong *)*pauVar44;
                  }
                  auVar92 = ZEXT3264(auVar91);
                  auVar100 = ZEXT3264(auVar99);
                  auVar102 = ZEXT3264(auVar101);
                  auVar107 = ZEXT3264(auVar107._0_32_);
                  auVar109 = ZEXT3264(auVar109._0_32_);
                  auVar110 = ZEXT3264(auVar110._0_32_);
                  auVar111 = ZEXT3264(auVar111._0_32_);
                  auVar114 = ZEXT3264(auVar114._0_32_);
                  auVar116 = ZEXT3264(auVar116._0_32_);
                  auVar119 = ZEXT3264(local_2640);
                  pauVar45 = pauVar44;
                  uVar46 = local_27d8;
                  iVar34 = 0;
                }
              }
            }
          }
        }
        else {
          iVar34 = 6;
        }
      } while (iVar34 == 0);
    } while (iVar34 != 6);
    local_2768 = (ulong)((uint)uVar48 & 0xf) - 8;
    if (local_2768 != 0) {
      uVar48 = uVar48 & 0xfffffffffffffff0;
      local_2748 = 0;
      local_27d0 = unaff_R13;
      do {
        lVar35 = local_2748 * 0x50;
        pSVar38 = context->scene;
        ppfVar9 = (pSVar38->vertices).items;
        pfVar10 = ppfVar9[*(uint *)(uVar48 + 0x30 + lVar35)];
        pfVar11 = ppfVar9[*(uint *)(uVar48 + 0x34 + lVar35)];
        pfVar12 = ppfVar9[*(uint *)(uVar48 + 0x38 + lVar35)];
        pfVar13 = ppfVar9[*(uint *)(uVar48 + 0x3c + lVar35)];
        auVar70 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar48 + lVar35)),
                                *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar48 + 8 + lVar35)));
        auVar57 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar48 + lVar35)),
                                *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar48 + 8 + lVar35)));
        auVar58 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar48 + 4 + lVar35)),
                                *(undefined1 (*) [16])(pfVar13 + *(uint *)(uVar48 + 0xc + lVar35)));
        auVar67 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar48 + 4 + lVar35)),
                                *(undefined1 (*) [16])(pfVar13 + *(uint *)(uVar48 + 0xc + lVar35)));
        auVar60 = vunpcklps_avx(auVar57,auVar67);
        auVar74 = vunpcklps_avx(auVar70,auVar58);
        auVar57 = vunpckhps_avx(auVar70,auVar58);
        auVar58 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar48 + 0x10 + lVar35)),
                                *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar48 + 0x18 + lVar35)))
        ;
        auVar67 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar48 + 0x10 + lVar35)),
                                *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar48 + 0x18 + lVar35)))
        ;
        auVar80 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar48 + 0x14 + lVar35)),
                                *(undefined1 (*) [16])(pfVar13 + *(uint *)(uVar48 + 0x1c + lVar35)))
        ;
        auVar70 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar48 + 0x14 + lVar35)),
                                *(undefined1 (*) [16])(pfVar13 + *(uint *)(uVar48 + 0x1c + lVar35)))
        ;
        auVar52 = vunpcklps_avx(auVar67,auVar70);
        auVar50 = vunpcklps_avx(auVar58,auVar80);
        auVar67 = vunpckhps_avx(auVar58,auVar80);
        auVar80 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar48 + 0x20 + lVar35)),
                                *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar48 + 0x28 + lVar35)))
        ;
        auVar70 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar48 + 0x20 + lVar35)),
                                *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar48 + 0x28 + lVar35)))
        ;
        auVar51 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar48 + 0x24 + lVar35)),
                                *(undefined1 (*) [16])(pfVar13 + *(uint *)(uVar48 + 0x2c + lVar35)))
        ;
        auVar58 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar48 + 0x24 + lVar35)),
                                *(undefined1 (*) [16])(pfVar13 + *(uint *)(uVar48 + 0x2c + lVar35)))
        ;
        auVar59 = vunpcklps_avx(auVar70,auVar58);
        auVar58 = vunpcklps_avx(auVar80,auVar51);
        auVar80 = vunpckhps_avx(auVar80,auVar51);
        puVar1 = (undefined8 *)(uVar48 + 0x30 + lVar35);
        local_2560 = *puVar1;
        uStack_2558 = puVar1[1];
        puVar1 = (undefined8 *)(uVar48 + 0x40 + lVar35);
        local_2710 = *puVar1;
        uStack_2708 = puVar1[1];
        local_26d0 = &local_27e9;
        uVar49 = *(undefined4 *)(ray + k * 4);
        auVar108._4_4_ = uVar49;
        auVar108._0_4_ = uVar49;
        auVar108._8_4_ = uVar49;
        auVar108._12_4_ = uVar49;
        uVar49 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar112._4_4_ = uVar49;
        auVar112._0_4_ = uVar49;
        auVar112._8_4_ = uVar49;
        auVar112._12_4_ = uVar49;
        uVar49 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar115._4_4_ = uVar49;
        auVar115._0_4_ = uVar49;
        auVar115._8_4_ = uVar49;
        auVar115._12_4_ = uVar49;
        local_2570 = vsubps_avx(auVar74,auVar108);
        local_2580 = vsubps_avx(auVar57,auVar112);
        local_2590 = vsubps_avx(auVar60,auVar115);
        auVar57 = vsubps_avx(auVar50,auVar108);
        auVar67 = vsubps_avx(auVar67,auVar112);
        auVar70 = vsubps_avx(auVar52,auVar115);
        auVar58 = vsubps_avx(auVar58,auVar108);
        auVar80 = vsubps_avx(auVar80,auVar112);
        auVar60 = vsubps_avx(auVar59,auVar115);
        local_25a0 = vsubps_avx(auVar58,local_2570);
        local_25c0 = vsubps_avx(auVar80,local_2580);
        local_25b0 = vsubps_avx(auVar60,local_2590);
        auVar50._0_4_ = auVar58._0_4_ + local_2570._0_4_;
        auVar50._4_4_ = auVar58._4_4_ + local_2570._4_4_;
        auVar50._8_4_ = auVar58._8_4_ + local_2570._8_4_;
        auVar50._12_4_ = auVar58._12_4_ + local_2570._12_4_;
        auVar71._0_4_ = auVar80._0_4_ + local_2580._0_4_;
        auVar71._4_4_ = auVar80._4_4_ + local_2580._4_4_;
        auVar71._8_4_ = auVar80._8_4_ + local_2580._8_4_;
        auVar71._12_4_ = auVar80._12_4_ + local_2580._12_4_;
        fVar3 = local_2590._0_4_;
        auVar74._0_4_ = auVar60._0_4_ + fVar3;
        fVar4 = local_2590._4_4_;
        auVar74._4_4_ = auVar60._4_4_ + fVar4;
        fVar24 = local_2590._8_4_;
        auVar74._8_4_ = auVar60._8_4_ + fVar24;
        fVar15 = local_2590._12_4_;
        auVar74._12_4_ = auVar60._12_4_ + fVar15;
        auVar113._0_4_ = local_25b0._0_4_ * auVar71._0_4_;
        auVar113._4_4_ = local_25b0._4_4_ * auVar71._4_4_;
        auVar113._8_4_ = local_25b0._8_4_ * auVar71._8_4_;
        auVar113._12_4_ = local_25b0._12_4_ * auVar71._12_4_;
        auVar52 = vfmsub231ps_fma(auVar113,local_25c0,auVar74);
        auVar75._0_4_ = local_25a0._0_4_ * auVar74._0_4_;
        auVar75._4_4_ = local_25a0._4_4_ * auVar74._4_4_;
        auVar75._8_4_ = local_25a0._8_4_ * auVar74._8_4_;
        auVar75._12_4_ = local_25a0._12_4_ * auVar74._12_4_;
        auVar74 = vfmsub231ps_fma(auVar75,local_25b0,auVar50);
        auVar51._0_4_ = local_25c0._0_4_ * auVar50._0_4_;
        auVar51._4_4_ = local_25c0._4_4_ * auVar50._4_4_;
        auVar51._8_4_ = local_25c0._8_4_ * auVar50._8_4_;
        auVar51._12_4_ = local_25c0._12_4_ * auVar50._12_4_;
        auVar50 = vfmsub231ps_fma(auVar51,local_25a0,auVar71);
        fVar2 = *(float *)(ray + k * 4 + 0x60);
        auVar68._0_4_ = fVar2 * auVar50._0_4_;
        auVar68._4_4_ = fVar2 * auVar50._4_4_;
        auVar68._8_4_ = fVar2 * auVar50._8_4_;
        auVar68._12_4_ = fVar2 * auVar50._12_4_;
        uVar49 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar103._4_4_ = uVar49;
        auVar103._0_4_ = uVar49;
        auVar103._8_4_ = uVar49;
        auVar103._12_4_ = uVar49;
        auVar74 = vfmadd231ps_fma(auVar68,auVar103,auVar74);
        uVar49 = *(undefined4 *)(ray + k * 4 + 0x40);
        local_27a0._4_4_ = uVar49;
        local_27a0._0_4_ = uVar49;
        local_27a0._8_4_ = uVar49;
        local_27a0._12_4_ = uVar49;
        local_2600 = vfmadd231ps_fma(auVar74,local_27a0,auVar52);
        local_25d0 = vsubps_avx(local_2580,auVar67);
        local_25f0 = vsubps_avx(local_2590,auVar70);
        auVar72._0_4_ = local_2580._0_4_ + auVar67._0_4_;
        auVar72._4_4_ = local_2580._4_4_ + auVar67._4_4_;
        auVar72._8_4_ = local_2580._8_4_ + auVar67._8_4_;
        auVar72._12_4_ = local_2580._12_4_ + auVar67._12_4_;
        auVar76._0_4_ = auVar70._0_4_ + fVar3;
        auVar76._4_4_ = auVar70._4_4_ + fVar4;
        auVar76._8_4_ = auVar70._8_4_ + fVar24;
        auVar76._12_4_ = auVar70._12_4_ + fVar15;
        fVar16 = local_25f0._0_4_;
        auVar84._0_4_ = auVar72._0_4_ * fVar16;
        fVar18 = local_25f0._4_4_;
        auVar84._4_4_ = auVar72._4_4_ * fVar18;
        fVar20 = local_25f0._8_4_;
        auVar84._8_4_ = auVar72._8_4_ * fVar20;
        fVar22 = local_25f0._12_4_;
        auVar84._12_4_ = auVar72._12_4_ * fVar22;
        auVar52 = vfmsub231ps_fma(auVar84,local_25d0,auVar76);
        local_25e0 = vsubps_avx(local_2570,auVar57);
        fVar117 = local_25e0._0_4_;
        auVar93._0_4_ = fVar117 * auVar76._0_4_;
        fVar120 = local_25e0._4_4_;
        auVar93._4_4_ = fVar120 * auVar76._4_4_;
        fVar121 = local_25e0._8_4_;
        auVar93._8_4_ = fVar121 * auVar76._8_4_;
        fVar122 = local_25e0._12_4_;
        auVar93._12_4_ = fVar122 * auVar76._12_4_;
        auVar77._0_4_ = auVar57._0_4_ + local_2570._0_4_;
        auVar77._4_4_ = auVar57._4_4_ + local_2570._4_4_;
        auVar77._8_4_ = auVar57._8_4_ + local_2570._8_4_;
        auVar77._12_4_ = auVar57._12_4_ + local_2570._12_4_;
        auVar74 = vfmsub231ps_fma(auVar93,local_25f0,auVar77);
        fVar17 = local_25d0._0_4_;
        auVar78._0_4_ = auVar77._0_4_ * fVar17;
        fVar19 = local_25d0._4_4_;
        auVar78._4_4_ = auVar77._4_4_ * fVar19;
        fVar21 = local_25d0._8_4_;
        auVar78._8_4_ = auVar77._8_4_ * fVar21;
        fVar23 = local_25d0._12_4_;
        auVar78._12_4_ = auVar77._12_4_ * fVar23;
        auVar50 = vfmsub231ps_fma(auVar78,local_25e0,auVar72);
        auVar79._0_4_ = fVar2 * auVar50._0_4_;
        auVar79._4_4_ = fVar2 * auVar50._4_4_;
        auVar79._8_4_ = fVar2 * auVar50._8_4_;
        auVar79._12_4_ = fVar2 * auVar50._12_4_;
        auVar74 = vfmadd231ps_fma(auVar79,auVar103,auVar74);
        local_2700._16_16_ = vfmadd231ps_fma(auVar74,local_27a0,auVar52);
        auVar74 = vsubps_avx(auVar57,auVar58);
        auVar85._0_4_ = auVar57._0_4_ + auVar58._0_4_;
        auVar85._4_4_ = auVar57._4_4_ + auVar58._4_4_;
        auVar85._8_4_ = auVar57._8_4_ + auVar58._8_4_;
        auVar85._12_4_ = auVar57._12_4_ + auVar58._12_4_;
        auVar58 = vsubps_avx(auVar67,auVar80);
        auVar52._0_4_ = auVar67._0_4_ + auVar80._0_4_;
        auVar52._4_4_ = auVar67._4_4_ + auVar80._4_4_;
        auVar52._8_4_ = auVar67._8_4_ + auVar80._8_4_;
        auVar52._12_4_ = auVar67._12_4_ + auVar80._12_4_;
        auVar80 = vsubps_avx(auVar70,auVar60);
        auVar59._0_4_ = auVar70._0_4_ + auVar60._0_4_;
        auVar59._4_4_ = auVar70._4_4_ + auVar60._4_4_;
        auVar59._8_4_ = auVar70._8_4_ + auVar60._8_4_;
        auVar59._12_4_ = auVar70._12_4_ + auVar60._12_4_;
        auVar94._0_4_ = auVar52._0_4_ * auVar80._0_4_;
        auVar94._4_4_ = auVar52._4_4_ * auVar80._4_4_;
        auVar94._8_4_ = auVar52._8_4_ * auVar80._8_4_;
        auVar94._12_4_ = auVar52._12_4_ * auVar80._12_4_;
        auVar67 = vfmsub231ps_fma(auVar94,auVar58,auVar59);
        auVar60._0_4_ = auVar59._0_4_ * auVar74._0_4_;
        auVar60._4_4_ = auVar59._4_4_ * auVar74._4_4_;
        auVar60._8_4_ = auVar59._8_4_ * auVar74._8_4_;
        auVar60._12_4_ = auVar59._12_4_ * auVar74._12_4_;
        auVar57 = vfmsub231ps_fma(auVar60,auVar80,auVar85);
        auVar86._0_4_ = auVar58._0_4_ * auVar85._0_4_;
        auVar86._4_4_ = auVar58._4_4_ * auVar85._4_4_;
        auVar86._8_4_ = auVar58._8_4_ * auVar85._8_4_;
        auVar86._12_4_ = auVar58._12_4_ * auVar85._12_4_;
        auVar70 = vfmsub231ps_fma(auVar86,auVar74,auVar52);
        auVar87._0_4_ = fVar2 * auVar70._0_4_;
        auVar87._4_4_ = fVar2 * auVar70._4_4_;
        auVar87._8_4_ = fVar2 * auVar70._8_4_;
        auVar87._12_4_ = fVar2 * auVar70._12_4_;
        auVar57 = vfmadd231ps_fma(auVar87,auVar103,auVar57);
        auVar70 = vfmadd231ps_fma(auVar57,local_27a0,auVar67);
        local_26e0._0_4_ = auVar70._0_4_ + local_2600._0_4_ + local_2700._16_4_;
        local_26e0._4_4_ = auVar70._4_4_ + local_2600._4_4_ + local_2700._20_4_;
        local_26e0._8_4_ = auVar70._8_4_ + local_2600._8_4_ + local_2700._24_4_;
        local_26e0._12_4_ = auVar70._12_4_ + local_2600._12_4_ + local_2700._28_4_;
        auVar118._8_4_ = 0x7fffffff;
        auVar118._0_8_ = 0x7fffffff7fffffff;
        auVar118._12_4_ = 0x7fffffff;
        auVar57 = vminps_avx(local_2600,local_2700._16_16_);
        auVar57 = vminps_avx(auVar57,auVar70);
        local_2610 = vandps_avx(local_26e0,auVar118);
        auVar104._0_4_ = local_2610._0_4_ * 1.1920929e-07;
        auVar104._4_4_ = local_2610._4_4_ * 1.1920929e-07;
        auVar104._8_4_ = local_2610._8_4_ * 1.1920929e-07;
        auVar104._12_4_ = local_2610._12_4_ * 1.1920929e-07;
        uVar36 = CONCAT44(auVar104._4_4_,auVar104._0_4_);
        auVar95._0_8_ = uVar36 ^ 0x8000000080000000;
        auVar95._8_4_ = -auVar104._8_4_;
        auVar95._12_4_ = -auVar104._12_4_;
        auVar57 = vcmpps_avx(auVar57,auVar95,5);
        auVar67 = vmaxps_avx(local_2600,local_2700._16_16_);
        auVar67 = vmaxps_avx(auVar67,auVar70);
        auVar67 = vcmpps_avx(auVar67,auVar104,2);
        local_27b0 = vorps_avx(auVar57,auVar67);
        if ((((local_27b0 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (local_27b0 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (local_27b0 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            local_27b0[0xf] < '\0') {
          auVar61._0_4_ = fVar17 * local_25b0._0_4_;
          auVar61._4_4_ = fVar19 * local_25b0._4_4_;
          auVar61._8_4_ = fVar21 * local_25b0._8_4_;
          auVar61._12_4_ = fVar23 * local_25b0._12_4_;
          auVar88._0_4_ = fVar117 * local_25c0._0_4_;
          auVar88._4_4_ = fVar120 * local_25c0._4_4_;
          auVar88._8_4_ = fVar121 * local_25c0._8_4_;
          auVar88._12_4_ = fVar122 * local_25c0._12_4_;
          auVar70 = vfmsub213ps_fma(local_25c0,local_25f0,auVar61);
          auVar96._0_4_ = auVar58._0_4_ * fVar16;
          auVar96._4_4_ = auVar58._4_4_ * fVar18;
          auVar96._8_4_ = auVar58._8_4_ * fVar20;
          auVar96._12_4_ = auVar58._12_4_ * fVar22;
          auVar105._0_4_ = fVar117 * auVar80._0_4_;
          auVar105._4_4_ = fVar120 * auVar80._4_4_;
          auVar105._8_4_ = fVar121 * auVar80._8_4_;
          auVar105._12_4_ = fVar122 * auVar80._12_4_;
          auVar80 = vfmsub213ps_fma(auVar80,local_25d0,auVar96);
          auVar57 = vandps_avx(auVar118,auVar61);
          auVar67 = vandps_avx(auVar118,auVar96);
          auVar57 = vcmpps_avx(auVar57,auVar67,1);
          local_2680 = vblendvps_avx(auVar80,auVar70,auVar57);
          auVar81._0_4_ = fVar17 * auVar74._0_4_;
          auVar81._4_4_ = fVar19 * auVar74._4_4_;
          auVar81._8_4_ = fVar21 * auVar74._8_4_;
          auVar81._12_4_ = fVar23 * auVar74._12_4_;
          auVar70 = vfmsub213ps_fma(auVar74,local_25f0,auVar105);
          auVar97._0_4_ = local_25a0._0_4_ * fVar16;
          auVar97._4_4_ = local_25a0._4_4_ * fVar18;
          auVar97._8_4_ = local_25a0._8_4_ * fVar20;
          auVar97._12_4_ = local_25a0._12_4_ * fVar22;
          auVar80 = vfmsub213ps_fma(local_25b0,local_25e0,auVar97);
          auVar57 = vandps_avx(auVar118,auVar97);
          auVar67 = vandps_avx(auVar105,auVar118);
          auVar57 = vcmpps_avx(auVar57,auVar67,1);
          local_2670 = vblendvps_avx(auVar70,auVar80,auVar57);
          auVar70 = vfmsub213ps_fma(local_25a0,local_25d0,auVar88);
          auVar58 = vfmsub213ps_fma(auVar58,local_25e0,auVar81);
          auVar57 = vandps_avx(auVar118,auVar88);
          auVar67 = vandps_avx(auVar118,auVar81);
          auVar57 = vcmpps_avx(auVar57,auVar67,1);
          local_2660[0] = vblendvps_avx(auVar58,auVar70,auVar57);
          auVar82._0_4_ = local_2660[0]._0_4_ * fVar2;
          auVar82._4_4_ = local_2660[0]._4_4_ * fVar2;
          auVar82._8_4_ = local_2660[0]._8_4_ * fVar2;
          auVar82._12_4_ = local_2660[0]._12_4_ * fVar2;
          auVar57 = vfmadd213ps_fma(auVar103,local_2670,auVar82);
          auVar57 = vfmadd213ps_fma(local_27a0,local_2680,auVar57);
          auVar83._0_4_ = auVar57._0_4_ + auVar57._0_4_;
          auVar83._4_4_ = auVar57._4_4_ + auVar57._4_4_;
          auVar83._8_4_ = auVar57._8_4_ + auVar57._8_4_;
          auVar83._12_4_ = auVar57._12_4_ + auVar57._12_4_;
          auVar89._0_4_ = local_2660[0]._0_4_ * fVar3;
          auVar89._4_4_ = local_2660[0]._4_4_ * fVar4;
          auVar89._8_4_ = local_2660[0]._8_4_ * fVar24;
          auVar89._12_4_ = local_2660[0]._12_4_ * fVar15;
          auVar57 = vfmadd213ps_fma(local_2580,local_2670,auVar89);
          auVar67 = vfmadd213ps_fma(local_2570,local_2680,auVar57);
          auVar57 = vrcpps_avx(auVar83);
          auVar106._8_4_ = 0x3f800000;
          auVar106._0_8_ = &DAT_3f8000003f800000;
          auVar106._12_4_ = 0x3f800000;
          auVar70 = vfnmadd213ps_fma(auVar57,auVar83,auVar106);
          auVar57 = vfmadd132ps_fma(auVar70,auVar57,auVar57);
          local_2690._0_4_ = auVar57._0_4_ * (auVar67._0_4_ + auVar67._0_4_);
          local_2690._4_4_ = auVar57._4_4_ * (auVar67._4_4_ + auVar67._4_4_);
          local_2690._8_4_ = auVar57._8_4_ * (auVar67._8_4_ + auVar67._8_4_);
          local_2690._12_4_ = auVar57._12_4_ * (auVar67._12_4_ + auVar67._12_4_);
          auVar56 = ZEXT1664(local_2690);
          uVar49 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar90._4_4_ = uVar49;
          auVar90._0_4_ = uVar49;
          auVar90._8_4_ = uVar49;
          auVar90._12_4_ = uVar49;
          auVar57 = vcmpps_avx(auVar90,local_2690,2);
          uVar49 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar98._4_4_ = uVar49;
          auVar98._0_4_ = uVar49;
          auVar98._8_4_ = uVar49;
          auVar98._12_4_ = uVar49;
          auVar67 = vcmpps_avx(local_2690,auVar98,2);
          auVar57 = vandps_avx(auVar57,auVar67);
          auVar67 = local_27b0 & auVar57;
          if ((((auVar67 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar67 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar67 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar67[0xf] < '\0') {
            auVar57 = vandps_avx(auVar57,local_27b0);
            auVar67 = vcmpps_avx(auVar83,_DAT_01feba10,4);
            auVar70 = auVar67 & auVar57;
            if ((((auVar70 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar70 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar70[0xf] < '\0') {
              local_2790 = vandps_avx(auVar57,auVar67);
              local_2700._0_16_ = local_2600;
              local_26d0 = &local_27e9;
              local_26c0 = local_2790;
              auVar57 = vrcpps_avx(local_26e0);
              auVar69._8_4_ = 0x3f800000;
              auVar69._0_8_ = &DAT_3f8000003f800000;
              auVar69._12_4_ = 0x3f800000;
              auVar67 = vfnmadd213ps_fma(local_26e0,auVar57,auVar69);
              auVar67 = vfmadd132ps_fma(auVar67,auVar57,auVar57);
              auVar62._8_4_ = 0x219392ef;
              auVar62._0_8_ = 0x219392ef219392ef;
              auVar62._12_4_ = 0x219392ef;
              auVar57 = vcmpps_avx(local_2610,auVar62,5);
              auVar57 = vandps_avx(auVar67,auVar57);
              auVar53._0_4_ = local_2600._0_4_ * auVar57._0_4_;
              auVar53._4_4_ = local_2600._4_4_ * auVar57._4_4_;
              auVar53._8_4_ = local_2600._8_4_ * auVar57._8_4_;
              auVar53._12_4_ = local_2600._12_4_ * auVar57._12_4_;
              local_26b0 = vminps_avx(auVar53,auVar69);
              auVar54._0_4_ = auVar57._0_4_ * local_2700._16_4_;
              auVar54._4_4_ = auVar57._4_4_ * local_2700._20_4_;
              auVar54._8_4_ = auVar57._8_4_ * local_2700._24_4_;
              auVar54._12_4_ = auVar57._12_4_ * local_2700._28_4_;
              local_26a0 = vminps_avx(auVar54,auVar69);
              auVar63._8_4_ = 0x7f800000;
              auVar63._0_8_ = 0x7f8000007f800000;
              auVar63._12_4_ = 0x7f800000;
              auVar57 = vblendvps_avx(auVar63,local_2690,local_2790);
              auVar67 = vshufps_avx(auVar57,auVar57,0xb1);
              auVar67 = vminps_avx(auVar67,auVar57);
              auVar70 = vshufpd_avx(auVar67,auVar67,1);
              auVar67 = vminps_avx(auVar70,auVar67);
              auVar67 = vcmpps_avx(auVar57,auVar67,0);
              auVar70 = local_2790 & auVar67;
              auVar57 = vpcmpeqd_avx(auVar57,auVar57);
              if ((((auVar70 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar70 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar70[0xf] < '\0') {
                auVar57 = auVar67;
              }
              auVar57 = vandps_avx(local_2790,auVar57);
              uVar49 = vmovmskps_avx(auVar57);
              lVar35 = 0;
              for (uVar36 = CONCAT44((int)((ulong)&local_27e9 >> 0x20),uVar49); local_27c8 = pSVar38
                  , (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
                lVar35 = lVar35 + 1;
              }
              do {
                uVar7 = *(uint *)((long)&local_2560 + lVar35 * 4);
                pRVar37 = (RayHitK<4> *)(ulong)uVar7;
                pGVar14 = (pSVar38->geometries).items[(long)pRVar37].ptr;
                if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  *(undefined4 *)(local_2790 + lVar35 * 4) = 0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar49 = *(undefined4 *)(local_26b0 + lVar35 * 4);
                    uVar5 = *(undefined4 *)(local_26a0 + lVar35 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2690 + lVar35 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2680 + lVar35 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2670 + lVar35 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xe0) =
                         *(undefined4 *)(local_2660[0] + lVar35 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar49;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar5;
                    *(undefined4 *)(ray + k * 4 + 0x110) =
                         *(undefined4 *)((long)&local_2710 + lVar35 * 4);
                    *(uint *)(ray + k * 4 + 0x120) = uVar7;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    unaff_R13 = local_27d0;
                    break;
                  }
                  uVar49 = *(undefined4 *)(local_26b0 + lVar35 * 4);
                  local_2520._4_4_ = uVar49;
                  local_2520._0_4_ = uVar49;
                  local_2520._8_4_ = uVar49;
                  local_2520._12_4_ = uVar49;
                  uVar49 = *(undefined4 *)(local_26a0 + lVar35 * 4);
                  auVar64._4_4_ = uVar49;
                  auVar64._0_4_ = uVar49;
                  auVar64._8_4_ = uVar49;
                  auVar64._12_4_ = uVar49;
                  local_24f0._4_4_ = uVar7;
                  local_24f0._0_4_ = uVar7;
                  local_24f0._8_4_ = uVar7;
                  local_24f0._12_4_ = uVar7;
                  uVar49 = *(undefined4 *)((long)&local_2710 + lVar35 * 4);
                  auVar73._4_4_ = uVar49;
                  auVar73._0_4_ = uVar49;
                  auVar73._8_4_ = uVar49;
                  auVar73._12_4_ = uVar49;
                  uVar49 = *(undefined4 *)(local_2680 + lVar35 * 4);
                  local_2550._4_4_ = uVar49;
                  local_2550._0_4_ = uVar49;
                  local_2550._8_4_ = uVar49;
                  local_2550._12_4_ = uVar49;
                  uVar49 = *(undefined4 *)(local_2670 + lVar35 * 4);
                  local_2540._4_4_ = uVar49;
                  local_2540._0_4_ = uVar49;
                  local_2540._8_4_ = uVar49;
                  local_2540._12_4_ = uVar49;
                  uVar49 = *(undefined4 *)(local_2660[0] + lVar35 * 4);
                  local_2530._4_4_ = uVar49;
                  local_2530._0_4_ = uVar49;
                  local_2530._8_4_ = uVar49;
                  local_2530._12_4_ = uVar49;
                  local_2510 = auVar64;
                  local_2500 = auVar73;
                  vpcmpeqd_avx2(ZEXT1632(local_2520),ZEXT1632(local_2520));
                  uStack_24dc = context->user->instID[0];
                  local_24e0 = uStack_24dc;
                  uStack_24d8 = uStack_24dc;
                  uStack_24d4 = uStack_24dc;
                  uStack_24d0 = context->user->instPrimID[0];
                  uStack_24cc = uStack_24d0;
                  uStack_24c8 = uStack_24d0;
                  uStack_24c4 = uStack_24d0;
                  local_27a0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2690 + lVar35 * 4);
                  local_2780 = *local_2770;
                  uStack_2778 = local_2770[1];
                  local_2740 = &local_2780;
                  local_2738 = pGVar14->userPtr;
                  local_2730 = context->user;
                  local_2720 = &local_2550;
                  local_2718 = 4;
                  pRVar37 = (RayHitK<4> *)pGVar14->intersectionFilterN;
                  local_27c0 = auVar56._0_16_;
                  local_2728 = ray;
                  if (pRVar37 != (RayHitK<4> *)0x0) {
                    local_27b0._0_8_ = pauVar45;
                    pRVar37 = (RayHitK<4> *)(*(code *)pRVar37)(&local_2740);
                    auVar56._8_56_ = extraout_var;
                    auVar56._0_8_ = extraout_XMM1_Qa;
                    auVar64 = auVar56._0_16_;
                    auVar56 = ZEXT1664(local_27c0);
                    pSVar38 = local_27c8;
                    uVar43 = local_27e8;
                    pauVar45 = (undefined1 (*) [16])local_27b0._0_8_;
                    uVar46 = local_27d8;
                  }
                  auVar32._8_8_ = uStack_2778;
                  auVar32._0_8_ = local_2780;
                  if (auVar32 == (undefined1  [16])0x0) {
                    auVar57 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                    auVar67 = vpcmpeqd_avx(auVar64,auVar64);
                    auVar57 = auVar57 ^ auVar67;
                  }
                  else {
                    pRVar37 = (RayHitK<4> *)context->args->filter;
                    auVar67 = vpcmpeqd_avx(auVar73,auVar73);
                    if ((pRVar37 != (RayHitK<4> *)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                      pRVar37 = (RayHitK<4> *)(*(code *)pRVar37)(&local_2740);
                      auVar56 = ZEXT1664(local_27c0);
                      auVar67 = vpcmpeqd_avx(auVar67,auVar67);
                      pSVar38 = local_27c8;
                      uVar43 = local_27e8;
                      uVar46 = local_27d8;
                    }
                    auVar33._8_8_ = uStack_2778;
                    auVar33._0_8_ = local_2780;
                    auVar70 = vpcmpeqd_avx(auVar33,_DAT_01feba10);
                    auVar57 = auVar70 ^ auVar67;
                    if (auVar33 != (undefined1  [16])0x0) {
                      auVar70 = auVar70 ^ auVar67;
                      auVar67 = vmaskmovps_avx(auVar70,*local_2720);
                      *(undefined1 (*) [16])(local_2728 + 0xc0) = auVar67;
                      auVar67 = vmaskmovps_avx(auVar70,local_2720[1]);
                      *(undefined1 (*) [16])(local_2728 + 0xd0) = auVar67;
                      auVar67 = vmaskmovps_avx(auVar70,local_2720[2]);
                      *(undefined1 (*) [16])(local_2728 + 0xe0) = auVar67;
                      auVar67 = vmaskmovps_avx(auVar70,local_2720[3]);
                      *(undefined1 (*) [16])(local_2728 + 0xf0) = auVar67;
                      auVar67 = vmaskmovps_avx(auVar70,local_2720[4]);
                      *(undefined1 (*) [16])(local_2728 + 0x100) = auVar67;
                      auVar67 = vmaskmovps_avx(auVar70,local_2720[5]);
                      *(undefined1 (*) [16])(local_2728 + 0x110) = auVar67;
                      auVar67 = vmaskmovps_avx(auVar70,local_2720[6]);
                      *(undefined1 (*) [16])(local_2728 + 0x120) = auVar67;
                      auVar67 = vmaskmovps_avx(auVar70,local_2720[7]);
                      *(undefined1 (*) [16])(local_2728 + 0x130) = auVar67;
                      auVar67 = vmaskmovps_avx(auVar70,local_2720[8]);
                      *(undefined1 (*) [16])(local_2728 + 0x140) = auVar67;
                      pRVar37 = local_2728;
                    }
                  }
                  auVar66._8_8_ = 0x100000001;
                  auVar66._0_8_ = 0x100000001;
                  if ((auVar66 & auVar57) == (undefined1  [16])0x0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_27a0._0_4_;
                  }
                  *(undefined4 *)(local_2790 + lVar35 * 4) = 0;
                  uVar49 = *(undefined4 *)(ray + k * 4 + 0x80);
                  auVar55._4_4_ = uVar49;
                  auVar55._0_4_ = uVar49;
                  auVar55._8_4_ = uVar49;
                  auVar55._12_4_ = uVar49;
                  auVar57 = vcmpps_avx(auVar56._0_16_,auVar55,2);
                  local_2790 = vandps_avx(auVar57,local_2790);
                }
                unaff_R13 = local_27d0;
                if ((((local_2790 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (local_2790 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (local_2790 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < local_2790[0xf]) break;
                auVar65._8_4_ = 0x7f800000;
                auVar65._0_8_ = 0x7f8000007f800000;
                auVar65._12_4_ = 0x7f800000;
                auVar57 = vblendvps_avx(auVar65,auVar56._0_16_,local_2790);
                auVar67 = vshufps_avx(auVar57,auVar57,0xb1);
                auVar67 = vminps_avx(auVar67,auVar57);
                auVar70 = vshufpd_avx(auVar67,auVar67,1);
                auVar67 = vminps_avx(auVar70,auVar67);
                auVar67 = vcmpps_avx(auVar57,auVar67,0);
                auVar70 = local_2790 & auVar67;
                auVar57 = local_2790;
                if ((((auVar70 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar70 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar70[0xf] < '\0') {
                  auVar57 = vandps_avx(auVar67,local_2790);
                }
                uVar49 = vmovmskps_avx(auVar57);
                lVar35 = 0;
                for (uVar36 = CONCAT44((int)((ulong)pRVar37 >> 0x20),uVar49); (uVar36 & 1) == 0;
                    uVar36 = uVar36 >> 1 | 0x8000000000000000) {
                  lVar35 = lVar35 + 1;
                }
              } while( true );
            }
          }
        }
        local_2748 = local_2748 + 1;
      } while (local_2748 != local_2768);
    }
    uVar49 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar56 = ZEXT3264(CONCAT428(uVar49,CONCAT424(uVar49,CONCAT420(uVar49,CONCAT416(uVar49,CONCAT412
                                                  (uVar49,CONCAT48(uVar49,CONCAT44(uVar49,uVar49))))
                                                  ))));
    auVar92 = ZEXT3264(local_23c0);
    auVar100 = ZEXT3264(local_23e0);
    auVar102 = ZEXT3264(local_2400);
    auVar107 = ZEXT3264(local_2420);
    auVar109 = ZEXT3264(local_2440);
    auVar110 = ZEXT3264(local_2460);
    auVar111 = ZEXT3264(local_2480);
    auVar114 = ZEXT3264(local_24a0);
    auVar116 = ZEXT3264(local_24c0);
    auVar119 = ZEXT3264(local_2640);
    uVar36 = local_27e0;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }